

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O0

qint64 __thiscall
QHttpNetworkReplyPrivate::readReplyBodyChunked
          (QHttpNetworkReplyPrivate *this,QIODevice *socket,QByteDataBuffer *out)

{
  long lVar1;
  qint64 qVar2;
  qint64 *in_RDX;
  QByteDataBuffer *in_RSI;
  QHttpNetworkReplyPrivate *in_RDI;
  long in_FS_OFFSET;
  qint64 haveRead;
  qint64 haveRead_2;
  qint64 haveRead_1;
  qint64 bytes;
  char crlf_1 [2];
  char crlf [2];
  long local_38;
  QHttpNetworkReplyPrivate *this_00;
  QHttpNetworkReplyPrivate *in_stack_ffffffffffffffe8;
  undefined2 local_c;
  undefined2 local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0;
  this_00 = in_RDI;
  while( true ) {
    lVar1 = (**(code **)&(in_RSI->buffers).d.d[10].super_QArrayData)();
    if ((lVar1 == 0) || ((in_RDI->readBufferMaxSize != 0 && (in_RDI->readBufferMaxSize < local_38)))
       ) goto LAB_0030646c;
    if (((in_RDI->lastChunkRead & 1U) == 0) &&
       (in_RDI->currentChunkSize <= in_RDI->currentChunkRead)) {
      in_RDI->currentChunkSize = 0;
      in_RDI->currentChunkRead = 0;
      if (local_38 != 0) {
        local_a = 0xaaaa;
        lVar1 = QIODevice::read((char *)in_RSI,(longlong)&local_a);
        if (lVar1 != 2) goto LAB_0030646c;
        local_38 = local_38 + 2;
      }
      qVar2 = getChunkSize(this_00,(QIODevice *)in_RSI,in_RDX);
      local_38 = qVar2 + local_38;
      if (in_RDI->currentChunkSize == -1) goto LAB_0030646c;
    }
    if ((in_RDI->currentChunkSize == 0) || ((in_RDI->lastChunkRead & 1U) != 0)) break;
    qVar2 = readReplyBodyRaw(in_stack_ffffffffffffffe8,(QIODevice *)this_00,in_RSI,(qint64)out);
    in_RDI->currentChunkRead = qVar2 + in_RDI->currentChunkRead;
    local_38 = qVar2 + local_38;
  }
  in_RDI->lastChunkRead = true;
  local_c = 0xaaaa;
  lVar1 = QIODevice::read((char *)in_RSI,(longlong)&local_c);
  if (0 < lVar1) {
    local_38 = lVar1 + local_38;
  }
  if ((((lVar1 == 2) && ((char)local_c == '\r')) && (local_c._1_1_ == '\n')) ||
     ((lVar1 == 1 && ((char)local_c == '\n')))) {
    in_RDI->state = AllDoneState;
  }
  else if (((lVar1 != 1) || ((char)local_c != '\r')) && (0 < lVar1)) {
    in_RDI->forceConnectionCloseEnabled = true;
    in_RDI->state = AllDoneState;
  }
LAB_0030646c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_38;
}

Assistant:

qint64 QHttpNetworkReplyPrivate::readReplyBodyChunked(QIODevice *socket, QByteDataBuffer *out)
{
    qint64 bytes = 0;
    while (socket->bytesAvailable()) {

        if (readBufferMaxSize && (bytes > readBufferMaxSize))
            break;

        if (!lastChunkRead && currentChunkRead >= currentChunkSize) {
            // For the first chunk and when we're done with a chunk
            currentChunkSize = 0;
            currentChunkRead = 0;
            if (bytes) {
                // After a chunk
                char crlf[2];
                // read the "\r\n" after the chunk
                qint64 haveRead = socket->read(crlf, 2);
                // FIXME: This code is slightly broken and not optimal. What if the 2 bytes are not available yet?!
                // For nice reasons (the toLong in getChunkSize accepting \n at the beginning
                // it right now still works, but we should definitely fix this.

                if (haveRead != 2)
                    return bytes; // FIXME
                bytes += haveRead;
            }
            // Note that chunk size gets stored in currentChunkSize, what is returned is the bytes read
            bytes += getChunkSize(socket, &currentChunkSize);
            if (currentChunkSize == -1)
                break;
        }
        // if the chunk size is 0, end of the stream
        if (currentChunkSize == 0 || lastChunkRead) {
            lastChunkRead = true;
            // try to read the "\r\n" after the chunk
            char crlf[2];
            qint64 haveRead = socket->read(crlf, 2);
            if (haveRead > 0)
                bytes += haveRead;

            if ((haveRead == 2 && crlf[0] == '\r' && crlf[1] == '\n') || (haveRead == 1 && crlf[0] == '\n'))
                state = AllDoneState;
            else if (haveRead == 1 && crlf[0] == '\r')
                break; // Still waiting for the last \n
            else if (haveRead > 0) {
                // If we read something else then CRLF, we need to close the channel.
                forceConnectionCloseEnabled = true;
                state = AllDoneState;
            }
            break;
        }

        // otherwise, try to begin reading this chunk / to read what is missing for this chunk
        qint64 haveRead = readReplyBodyRaw (socket, out, currentChunkSize - currentChunkRead);
        currentChunkRead += haveRead;
        bytes += haveRead;

        // ### error checking here

    }
    return bytes;
}